

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::queryNeighbourhood
          (HighsCliqueTable *this,vector<int,_std::allocator<int>_> *neighbourhoodInds,
          int64_t *numQueries,CliqueVar v,CliqueVar *q,HighsInt N)

{
  bool bVar1;
  HighsInt HVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  i64 iVar3;
  undefined4 in_ECX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  long in_R8;
  int in_R9D;
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  neighbourhoodData;
  HighsInt i;
  HighsCliqueTable *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  CliqueVar v_00;
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  *this_00;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  HighsInt grainSize;
  anon_class_32_4_8f8caa33 *in_stack_ffffffffffffff78;
  HighsInt in_stack_ffffffffffffff80;
  HighsInt in_stack_ffffffffffffff84;
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  local_50;
  undefined4 local_3c;
  undefined4 local_38;
  int local_34;
  undefined4 local_30;
  int local_2c;
  long local_28;
  undefined4 local_4;
  
  grainSize = (HighsInt)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  v_00 = SUB84((ulong)in_stack_ffffffffffffff40 >> 0x20,0);
  local_2c = in_R9D;
  local_28 = in_R8;
  local_4 = in_ECX;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x531a00);
  local_30 = local_4;
  HVar2 = numCliques(in_stack_ffffffffffffff38,v_00);
  if (HVar2 != 0) {
    end._M_current = (int *)(long)((HighsCliqueTable *)in_RDI._M_current)->numEntries;
    iVar3 = HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
            ::size(&((HighsCliqueTable *)in_RDI._M_current)->sizeTwoCliques);
    if ((long)end._M_current + iVar3 * -2 <
        (long)((HighsCliqueTable *)in_RDI._M_current)->minEntriesForParallelism) {
      for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 1) {
        local_38 = local_4;
        local_3c = *(undefined4 *)(local_28 + (long)local_34 * 4);
        bVar1 = haveCommonClique((HighsCliqueTable *)in_RDI._M_current,(int64_t *)end._M_current,
                                 SUB84(in_stack_ffffffffffffff60,0),
                                 SUB84((ulong)in_stack_ffffffffffffff58 >> 0x20,0));
        if (bVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_RDI._M_current,end._M_current);
        }
      }
    }
    else {
      this_00 = &local_50;
      makeHighsCombinable<ThreadNeighbourhoodQueryData,HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__0>
                ((anon_class_4_1_54a397ee_for_construct_ *)in_stack_ffffffffffffff38);
      ::highs::parallel::
      for_each<HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__1>
                (in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 grainSize);
      HighsCombinable<ThreadNeighbourhoodQueryData,HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::$_0>
      ::
      combine_each<HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__2>
                ((HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
                  *)in_RDI._M_current,(anon_class_16_2_b11256ca *)end._M_current);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>(in_RDI,end);
      HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>
      ::~HighsCombinable(this_00);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::queryNeighbourhood(
    std::vector<HighsInt>& neighbourhoodInds, int64_t& numQueries, CliqueVar v,
    CliqueVar* q, HighsInt N) const {
  neighbourhoodInds.clear();

  if (numCliques(v) == 0) return;

  if (numEntries - sizeTwoCliques.size() * 2 < minEntriesForParallelism) {
    for (HighsInt i = 0; i < N; ++i) {
      if (haveCommonClique(numQueries, v, q[i])) neighbourhoodInds.push_back(i);
    }
  } else {
    auto neighbourhoodData =
        makeHighsCombinable<ThreadNeighbourhoodQueryData>([N]() {
          ThreadNeighbourhoodQueryData d;
          d.neighbourhoodInds.reserve(N);
          d.numQueries = 0;
          return d;
        });
    highs::parallel::for_each(
        0, N,
        [this, &neighbourhoodData, v, q](HighsInt start, HighsInt end) {
          ThreadNeighbourhoodQueryData& d = neighbourhoodData.local();
          for (HighsInt i = start; i < end; ++i) {
            if (haveCommonClique(d.numQueries, v, q[i]))
              d.neighbourhoodInds.push_back(i);
          }
        },
        10);

    neighbourhoodData.combine_each([&](ThreadNeighbourhoodQueryData& d) {
      neighbourhoodInds.insert(neighbourhoodInds.end(),
                               d.neighbourhoodInds.begin(),
                               d.neighbourhoodInds.end());
      numQueries += d.numQueries;
    });
    pdqsort(neighbourhoodInds.begin(), neighbourhoodInds.end());
  }
}